

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O2

string * __thiscall ACIWnd::GetWndTitle_abi_cxx11_(string *__return_storage_ptr__,ACIWnd *this)

{
  size_type sVar1;
  char *__rhs;
  string in_stack_ffffffffffffff98;
  string local_40 [32];
  
  sVar1 = (this->acKey).key._M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffa0,"A/C Info",
               (allocator<char> *)&stack0xffffffffffffff9f);
  }
  else {
    std::__cxx11::string::string(local_40,(string *)&(this->acKey).key);
    LTFlightData::FDStaticData::acId
              ((string *)&stack0xffffffffffffffa0,&this->stat,in_stack_ffffffffffffff98);
  }
  __rhs = "";
  if (this->bAuto != false) {
    __rhs = " (AUTO)";
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffa0,__rhs);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  if (sVar1 != 0) {
    std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ACIWnd::GetWndTitle () const
{
    return
    (acKey.empty() ? std::string(ACI_WND_TITLE) : stat.acId(std::string(acKey))) +
    (bAuto ? " (AUTO)" : "");
}